

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall Log4Int_Basics_Test::~Log4Int_Basics_Test(Log4Int_Basics_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Log4Int, Basics) {
    EXPECT_EQ(0, Log4Int(1));
    EXPECT_EQ(1, Log4Int(4));
    EXPECT_EQ(2, Log4Int(16));
    EXPECT_EQ(3, Log4Int(64));

    int v = 1;
    int log4 = 0, next = 4;
    for (int v = 1; v < 16385; ++v) {
        if (v == next) {
            ++log4;
            next *= 4;
        }
        EXPECT_EQ(log4, Log4Int(v));
    }
}